

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O2

bool __thiscall
sf::Shader::loadFromFile
          (Shader *this,string *vertexShaderFilename,string *geometryShaderFilename,
          string *fragmentShaderFilename)

{
  bool bVar1;
  ostream *poVar2;
  vector<char,_std::allocator<char>_> fragmentShader;
  vector<char,_std::allocator<char>_> geometryShader;
  vector<char,_std::allocator<char>_> vertexShader;
  _Vector_base<char,_std::allocator<char>_> local_78;
  _Vector_base<char,_std::allocator<char>_> local_58;
  _Vector_base<char,_std::allocator<char>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = anon_unknown.dwarf_12a9bc::getFileContents
                    (vertexShaderFilename,(vector<char,_std::allocator<char>_> *)&local_38);
  if (bVar1) {
    local_58._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar1 = anon_unknown.dwarf_12a9bc::getFileContents
                      (geometryShaderFilename,(vector<char,_std::allocator<char>_> *)&local_58);
    if (bVar1) {
      local_78._M_impl.super__Vector_impl_data._M_start = (char *)0x0;
      local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar1 = anon_unknown.dwarf_12a9bc::getFileContents
                        (fragmentShaderFilename,(vector<char,_std::allocator<char>_> *)&local_78);
      if (bVar1) {
        bVar1 = compile(this,local_38._M_impl.super__Vector_impl_data._M_start,
                        local_58._M_impl.super__Vector_impl_data._M_start,
                        local_78._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Failed to open fragment shader file \"");
        poVar2 = std::operator<<(poVar2,(string *)fragmentShaderFilename);
        poVar2 = std::operator<<(poVar2,"\"");
        std::endl<char,std::char_traits<char>>(poVar2);
        bVar1 = false;
      }
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_78);
    }
    else {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to open geometry shader file \"");
      poVar2 = std::operator<<(poVar2,(string *)geometryShaderFilename);
      poVar2 = std::operator<<(poVar2,"\"");
      std::endl<char,std::char_traits<char>>(poVar2);
      bVar1 = false;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_58);
  }
  else {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to open vertex shader file \"");
    poVar2 = std::operator<<(poVar2,(string *)vertexShaderFilename);
    poVar2 = std::operator<<(poVar2,"\"");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar1 = false;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_38);
  return bVar1;
}

Assistant:

bool Shader::loadFromFile(const std::string& vertexShaderFilename, const std::string& geometryShaderFilename, const std::string& fragmentShaderFilename)
{
    // Read the vertex shader file
    std::vector<char> vertexShader;
    if (!getFileContents(vertexShaderFilename, vertexShader))
    {
        err() << "Failed to open vertex shader file \"" << vertexShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the geometry shader file
    std::vector<char> geometryShader;
    if (!getFileContents(geometryShaderFilename, geometryShader))
    {
        err() << "Failed to open geometry shader file \"" << geometryShaderFilename << "\"" << std::endl;
        return false;
    }

    // Read the fragment shader file
    std::vector<char> fragmentShader;
    if (!getFileContents(fragmentShaderFilename, fragmentShader))
    {
        err() << "Failed to open fragment shader file \"" << fragmentShaderFilename << "\"" << std::endl;
        return false;
    }

    // Compile the shader program
    return compile(&vertexShader[0], &geometryShader[0], &fragmentShader[0]);
}